

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variable_suite.cpp
# Opt level: O0

void ctor_suite::construct_map_from_make_pair(void)

{
  undefined1 local_b7;
  undefined1 local_b6 [14];
  pair<const_char_*,_const_char_*> local_a8;
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  local_98;
  undefined1 local_38 [8];
  variable data;
  
  local_a8 = std::make_pair<char_const(&)[6],char_const(&)[9]>
                       ((char (*) [6])"alpha",(char (*) [9])"hydrogen");
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::pair<const_char_*,_const_char_*,_true>(&local_98,&local_a8);
  trial::dynamic::basic_map<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)local_38,&local_98);
  std::
  pair<const_trial::dynamic::basic_variable<std::allocator<char>_>,_trial::dynamic::basic_variable<std::allocator<char>_>_>
  ::~pair(&local_98);
  local_b6[0] = trial::dynamic::basic_variable<std::allocator<char>>::
                is<trial::dynamic::basic_map<std::allocator<char>>>
                          ((basic_variable<std::allocator<char>> *)local_38);
  local_b7 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("data.is<map>()","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/variable_suite.cpp"
             ,0x166,"void ctor_suite::construct_map_from_make_pair()",local_b6,&local_b7);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)local_38);
  return;
}

Assistant:

void construct_map_from_make_pair()
{
    variable data(map::make(std::make_pair("alpha", "hydrogen")));
    TRIAL_PROTOCOL_TEST_EQUAL(data.is<map>(), true);
}